

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

int Cudd_ApaPrintMinterm(FILE *fp,DdManager *dd,DdNode *node,int nvars)

{
  int iVar1;
  int iVar2;
  DdApaNumber number;
  int digits;
  int local_1c;
  
  number = Cudd_ApaCountMinterm(dd,node,nvars,&local_1c);
  if (number == (DdApaNumber)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = Cudd_ApaPrintDecimal(fp,local_1c,number);
    free(number);
    iVar2 = fprintf((FILE *)fp,"\n");
    if (iVar2 == -1) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
Cudd_ApaPrintMinterm(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars)
{
    int digits;
    int result;
    DdApaNumber count;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    result = Cudd_ApaPrintDecimal(fp,digits,count);
    ABC_FREE(count);
    if (fprintf(fp,"\n") == EOF) {
        return(0);
    }
    return(result);

}